

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O3

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefVectorOf<xercesc_4_0::DatatypeValidator> **objToLoad,int initSize,bool toAdopt,
               XSerializeEngine *serEng)

{
  bool bVar1;
  MemoryManager *pMVar2;
  BaseRefVectorOf<xercesc_4_0::DatatypeValidator> *pBVar3;
  DatatypeValidator *pDVar4;
  XMLSize_t XVar5;
  ulong uVar6;
  XMLSize_t vectorLength;
  XMLSize_t local_38;
  
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    pBVar3 = &(*objToLoad)->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>;
    if (pBVar3 == (BaseRefVectorOf<xercesc_4_0::DatatypeValidator> *)0x0) {
      pMVar2 = XSerializeEngine::getMemoryManager(serEng);
      pBVar3 = (BaseRefVectorOf<xercesc_4_0::DatatypeValidator> *)XMemory::operator_new(0x30,pMVar2)
      ;
      pMVar2 = XSerializeEngine::getMemoryManager(serEng);
      XVar5 = 0x10;
      if (-1 < initSize) {
        XVar5 = (XMLSize_t)(uint)initSize;
      }
      BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::BaseRefVectorOf(pBVar3,XVar5,toAdopt,pMVar2);
      pBVar3->_vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_00409c38;
      *objToLoad = (RefVectorOf<xercesc_4_0::DatatypeValidator> *)pBVar3;
    }
    XSerializeEngine::registerObject(serEng,pBVar3);
    local_38 = 0;
    XSerializeEngine::readSize(serEng,&local_38);
    if (local_38 != 0) {
      uVar6 = 0;
      do {
        pDVar4 = DatatypeValidator::loadDV(serEng);
        pBVar3 = &(*objToLoad)->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>;
        BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::ensureExtraCapacity(pBVar3,1);
        XVar5 = pBVar3->fCurCount;
        pBVar3->fElemList[XVar5] = pDVar4;
        pBVar3->fCurCount = XVar5 + 1;
        uVar6 = uVar6 + 1;
      } while (uVar6 < local_38);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefVectorOf<DatatypeValidator>** objToLoad
                                   , int                               initSize
                                   , bool                              toAdopt
                                   , XSerializeEngine&                 serEng)
{

    if (serEng.needToLoadObject((void**)objToLoad))
    {
        if (!*objToLoad)
        {
            if (initSize < 0)
                initSize = 16;

            *objToLoad = new (serEng.getMemoryManager())
                             RefVectorOf<DatatypeValidator>(
                                                            initSize
                                                          , toAdopt
                                                          , serEng.getMemoryManager()
                                                           );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t vectorLength = 0;
        serEng.readSize (vectorLength);
        for (XMLSize_t i = 0 ; i < vectorLength; i++)
        {
            DatatypeValidator*  data;
            data = DatatypeValidator::loadDV(serEng);
            (*objToLoad)->addElement(data);
        }
    }

}